

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O2

void Queue_Append(Queue *lead,Queue *follower)

{
  Queue_Node *pQVar1;
  uint __line;
  char *__assertion;
  
  if (lead == (Queue *)0x0) {
    __assertion = "lead!=NULL";
    __line = 0x50;
  }
  else {
    if (follower != (Queue *)0x0) {
      if (lead->last == (Queue_Node *)0x0) {
        pQVar1 = follower->last;
        lead->first = follower->first;
        lead->last = pQVar1;
        lead->size = follower->size;
      }
      else {
        lead->last->prev = follower->first;
        lead->last = follower->last;
        lead->size = lead->size + follower->size;
      }
      return;
    }
    __assertion = "follower!=NULL";
    __line = 0x51;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/GTSimeonov[P]IOPL_Project/src/misc/queue.c"
                ,__line,"void Queue_Append(struct Queue *, struct Queue *)");
}

Assistant:

void Queue_Append(struct Queue *lead,struct Queue *follower)
{
	assert(lead!=NULL);	
	assert(follower!=NULL);	
	if(lead->last==NULL)
	{
		lead->last=follower->last;
		lead->first=follower->first;
		lead->size=follower->size;
	}else
	{
		lead->last->prev=follower->first;
		lead->last=follower->last;
		lead->size+=follower->size;
	}
}